

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long&,unsigned_long&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args,
          unsigned_long *args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffad0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffad8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffae0;
  basic_appender<char> *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb18;
  level_enum in_stack_fffffffffffffb3c;
  log_msg *in_stack_fffffffffffffb40;
  string_view_t in_stack_fffffffffffffb48;
  string_view_t in_stack_fffffffffffffb58;
  source_loc in_stack_fffffffffffffb70;
  basic_string_view<char> local_438 [2];
  undefined8 local_418;
  undefined8 uStack_410;
  log_msg *local_408;
  buffer<char> *local_3a0;
  undefined8 local_398 [2];
  undefined8 local_388 [3];
  undefined8 local_370;
  undefined8 *local_368;
  undefined8 local_360;
  undefined8 local_358;
  basic_appender<char> local_350 [4];
  buffer<char> local_330 [9];
  undefined1 local_20a;
  byte local_209;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 local_40;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  pcVar1 = &stack0x00000008;
  local_208 = in_R9;
  local_200 = in_R8;
  local_1e8 = in_RDX;
  local_1e0 = in_RCX;
  local_209 = should_log(in_stack_fffffffffffffad8,
                         (level_enum)((ulong)in_stack_fffffffffffffad0 >> 0x20));
  local_20a = details::backtracer::enabled((backtracer *)0x2786b3);
  if (((local_209 & 1) != 0) || ((bool)local_20a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffad0,(allocator<char> *)in_stack_fffffffffffffac8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_350,local_330);
    local_360 = local_1e8;
    local_358 = local_1e0;
    local_110 = local_200;
    local_118 = local_208;
    local_30 = *local_200;
    local_28 = local_398;
    local_38 = local_388;
    local_40 = *local_208;
    local_100 = &local_370;
    local_108 = local_398;
    local_370 = 0x44;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb14;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb10;
    args_00.field_1.args_ = in_stack_fffffffffffffb18.args_;
    local_20 = local_30;
    local_18 = local_28;
    local_10 = local_40;
    local_8 = local_38;
    local_398[0] = local_30;
    local_388[0] = local_40;
    local_368 = local_108;
    local_3a0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb08,fmt_00,args_00);
    local_408 = *(log_msg **)(pcVar1 + 0x10);
    local_418 = *(undefined8 *)pcVar1;
    uStack_410 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_330);
    count = ::fmt::v11::detail::buffer<char>::size(local_330);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_438,pcVar1,count);
    uVar2 = uStack_410;
    log_msg_00 = local_408;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb70,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb3c,in_stack_fffffffffffffb48);
    log_it_(in_stack_fffffffffffffae0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x278968);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }